

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_by_2.c
# Opt level: O2

void WebRtcSpl_UpsampleBy2(int16_t *in,size_t len,int16_t *out,int32_t *filtState)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int iVar7;
  int32_t iVar8;
  size_t sVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int32_t iVar13;
  int32_t iVar14;
  int iVar15;
  int iVar16;
  
  iVar1 = filtState[3];
  iVar8 = filtState[7];
  iVar3 = *filtState;
  iVar6 = filtState[1];
  iVar2 = filtState[2];
  iVar14 = filtState[4];
  iVar5 = filtState[5];
  iVar13 = filtState[6];
  for (sVar9 = 0; len != sVar9; sVar9 = sVar9 + 1) {
    iVar15 = in[sVar9] * 0x400;
    iVar12 = ((iVar15 - iVar6 & 0xffffU) * 0xcd4 >> 0x10) + (iVar15 - iVar6 >> 0x10) * 0xcd4 + iVar3
    ;
    uVar10 = iVar12 - iVar2;
    iVar11 = ((uVar10 & 0xffff) * 0x5f79 >> 0x10) + ((int)uVar10 >> 0x10) * 0x5f79 + iVar6;
    uVar10 = iVar11 - iVar1;
    iVar1 = ((uVar10 & 0xffff) * 0xc178 >> 0x10) + ((int)uVar10 >> 0x10) * 0xc178 + iVar2;
    iVar7 = iVar1 + 0x200 >> 10;
    if (iVar7 < -0x7fff) {
      iVar7 = -0x8000;
    }
    if (0x7ffe < iVar7) {
      iVar7 = 0x7fff;
    }
    out[sVar9 * 2] = (int16_t)iVar7;
    iVar16 = ((iVar15 - iVar5 & 0xffffU) * 0x2fa7 >> 0x10) +
             (iVar15 - iVar5 >> 0x10) * 0x2fa7 + iVar14;
    uVar10 = iVar16 - iVar13;
    iVar4 = ((uVar10 & 0xffff) * 0x925f >> 0x10) + ((int)uVar10 >> 0x10) * 0x925f + iVar5;
    uVar10 = iVar4 - iVar8;
    iVar8 = ((uVar10 & 0xffff) * 0xeb5f >> 0x10) + ((int)uVar10 >> 0x10) * 0xeb5f + iVar13;
    iVar7 = iVar8 + 0x200 >> 10;
    if (iVar7 < -0x7fff) {
      iVar7 = -0x8000;
    }
    if (0x7ffe < iVar7) {
      iVar7 = 0x7fff;
    }
    out[sVar9 * 2 + 1] = (int16_t)iVar7;
    iVar3 = iVar15;
    iVar6 = iVar12;
    iVar2 = iVar11;
    iVar14 = iVar15;
    iVar5 = iVar16;
    iVar13 = iVar4;
  }
  *filtState = iVar3;
  filtState[1] = iVar6;
  filtState[2] = iVar2;
  filtState[3] = iVar1;
  filtState[4] = iVar14;
  filtState[5] = iVar5;
  filtState[6] = iVar13;
  filtState[7] = iVar8;
  return;
}

Assistant:

void WebRtcSpl_UpsampleBy2(const int16_t* in, size_t len,
                           int16_t* out, int32_t* filtState) {
  int32_t tmp1, tmp2, diff, in32, out32;
  size_t i;

  register int32_t state0 = filtState[0];
  register int32_t state1 = filtState[1];
  register int32_t state2 = filtState[2];
  register int32_t state3 = filtState[3];
  register int32_t state4 = filtState[4];
  register int32_t state5 = filtState[5];
  register int32_t state6 = filtState[6];
  register int32_t state7 = filtState[7];

  for (i = len; i > 0; i--) {
    // lower allpass filter
    in32 = (int32_t)(*in++) << 10;
    diff = in32 - state1;
    tmp1 = MUL_ACCUM_1(kResampleAllpass1[0], diff, state0);
    state0 = in32;
    diff = tmp1 - state2;
    tmp2 = MUL_ACCUM_1(kResampleAllpass1[1], diff, state1);
    state1 = tmp1;
    diff = tmp2 - state3;
    state3 = MUL_ACCUM_2(kResampleAllpass1[2], diff, state2);
    state2 = tmp2;

    // round; limit amplitude to prevent wrap-around; write to output array
    out32 = (state3 + 512) >> 10;
    *out++ = WebRtcSpl_SatW32ToW16(out32);

    // upper allpass filter
    diff = in32 - state5;
    tmp1 = MUL_ACCUM_1(kResampleAllpass2[0], diff, state4);
    state4 = in32;
    diff = tmp1 - state6;
    tmp2 = MUL_ACCUM_2(kResampleAllpass2[1], diff, state5);
    state5 = tmp1;
    diff = tmp2 - state7;
    state7 = MUL_ACCUM_2(kResampleAllpass2[2], diff, state6);
    state6 = tmp2;

    // round; limit amplitude to prevent wrap-around; write to output array
    out32 = (state7 + 512) >> 10;
    *out++ = WebRtcSpl_SatW32ToW16(out32);
  }

  filtState[0] = state0;
  filtState[1] = state1;
  filtState[2] = state2;
  filtState[3] = state3;
  filtState[4] = state4;
  filtState[5] = state5;
  filtState[6] = state6;
  filtState[7] = state7;
}